

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O0

void open_stream(char *name,FILE *fp)

{
  long lVar1;
  InputFile *new;
  FILE *fp_local;
  char *name_local;
  
  lVar1 = (long)file_stack_ptr;
  if (file_stack_ptr < 0x20) {
    file_stack[lVar1].fp = fp;
    file_stack[lVar1].lineno = 1;
    strncpy(file_stack[lVar1].filename,name,0xf7);
    file_stack[lVar1].filename[0xf7] = '\0';
    file_stack_ptr = file_stack_ptr + 1;
  }
  return;
}

Assistant:

void
open_stream (const char *name, FILE *fp)
{
  InputFile *new = &file_stack[file_stack_ptr];

  if (file_stack_ptr >= MAX_INCLUDE_DEPTH)
    return;

  /* Add this file to the file input stack. */
  new->fp = fp;
  new->lineno = 1;
  strncpy (new->filename, name, MAX_FILENAME_LENGTH - 1);
  new->filename[MAX_FILENAME_LENGTH - 1] = '\0';
  file_stack_ptr++;
}